

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O3

Polynomial<unsigned_int,_double> * __thiscall
cimod::BinaryPolynomialModel<unsigned_int,_double>::ToHubo
          (Polynomial<unsigned_int,_double> *__return_storage_ptr__,
          BinaryPolynomialModel<unsigned_int,_double> *this)

{
  pointer puVar1;
  pointer puVar2;
  long lVar3;
  long lVar4;
  mapped_type *pmVar5;
  long lVar6;
  long lVar7;
  size_t num_of_key;
  size_t sVar8;
  double dVar9;
  undefined1 auVar10 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> changed_key;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  long local_68;
  long local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_58;
  double local_50;
  double local_48;
  double dStack_40;
  
  if (this->vartype_ == BINARY) {
    GetPolynomial(__return_storage_ptr__,this);
  }
  else {
    (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
    (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
    (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->_M_h)._M_element_count = 0;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
    (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    lVar3 = (long)(this->poly_key_list_).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->poly_key_list_).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (lVar3 != 0) {
      local_68 = (lVar3 >> 3) * -0x5555555555555555;
      local_68 = local_68 + (ulong)(local_68 == 0);
      local_60 = 0;
      do {
        local_58 = (this->poly_key_list_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        puVar1 = *(pointer *)
                  ((long)&local_58[local_60].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data + 8);
        puVar2 = local_58[local_60].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar7 = (long)puVar1 - (long)puVar2 >> 2;
        local_50 = (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[local_60];
        sVar8 = 1;
        lVar3 = lVar7;
        if (puVar1 == puVar2) {
LAB_001a73a5:
          local_58 = local_58 + local_60;
          num_of_key = 0;
          do {
            GenerateChangedKey(&local_80,this,local_58,num_of_key);
            lVar3 = (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 2;
            local_48 = 1.0;
            dStack_40 = 0.0;
            if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              lVar4 = 1;
              lVar6 = lVar3;
              do {
                lVar4 = lVar4 * 2;
                lVar6 = lVar6 + -1;
              } while (lVar6 != 0);
              auVar10._8_4_ = (int)((ulong)lVar4 >> 0x20);
              auVar10._0_8_ = lVar4;
              auVar10._12_4_ = 0x45300000;
              dStack_40 = auVar10._8_8_ - 1.9342813113834067e+25;
              local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
            }
            pmVar5 = std::__detail::
                     _Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)__return_storage_ptr__,&local_80);
            dVar9 = local_48 * local_50;
            if (((int)lVar7 - (int)lVar3 & 1U) != 0) {
              dVar9 = -dVar9;
            }
            *pmVar5 = dVar9 + *pmVar5;
            pmVar5 = std::__detail::
                     _Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)__return_storage_ptr__,&local_80);
            if ((*pmVar5 == 0.0) && (!NAN(*pmVar5))) {
              std::
              _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::_M_erase(&__return_storage_ptr__->_M_h,&local_80);
            }
            if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_80.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_80.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_80.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            num_of_key = num_of_key + 1;
          } while (num_of_key != sVar8);
        }
        else {
          do {
            sVar8 = sVar8 * 2;
            lVar3 = lVar3 + -1;
          } while (lVar3 != 0);
          if (sVar8 != 0) goto LAB_001a73a5;
        }
        local_60 = local_60 + 1;
      } while (local_60 != local_68);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Polynomial<IndexType, FloatType> ToHubo() const {
      if ( vartype_ == Vartype::BINARY ) {
        return GetPolynomial();
      }
      Polynomial<IndexType, FloatType> poly_map;
      std::size_t num_interactions = GetNumInteractions();
      for ( std::size_t i = 0; i < num_interactions; ++i ) {
        const std::vector<IndexType> &original_key = poly_key_list_[ i ];
        const FloatType original_value = poly_value_list_[ i ];
        const std::size_t original_key_size = original_key.size();
        const std::size_t changed_key_list_size = IntegerPower( 2, original_key_size );

        for ( std::size_t j = 0; j < changed_key_list_size; ++j ) {
          const auto changed_key = GenerateChangedKey( original_key, j );
          int sign = ( ( original_key_size - changed_key.size() ) % 2 == 0 ) ? 1.0 : -1.0;
          FloatType changed_value = original_value * IntegerPower( 2, changed_key.size() ) * sign;
          poly_map[ changed_key ] += changed_value;
          if ( poly_map[ changed_key ] == 0.0 ) {
            poly_map.erase( changed_key );
          }
        }
      }
      return poly_map;
    }